

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Articulated_Parts_PDU::operator==
          (Articulated_Parts_PDU *this,Articulated_Parts_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Articulated_Parts_PDU *Value_local;
  Articulated_Parts_PDU *this_local;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams) {
    bVar2 = std::operator!=(&this->m_vVariableParameters,&Value->m_vVariableParameters);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Articulated_Parts_PDU::operator == ( const Articulated_Parts_PDU & Value ) const
{
    if( LE_Header::operator      != ( Value ) )                     return false;
    if( m_ui8NumOfVariableParams != Value.m_ui8NumOfVariableParams )return false;
    if( m_vVariableParameters    != Value.m_vVariableParameters )   return false;
    return true;
}